

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::run(MultiMemoryLowering *this,Module *module)

{
  size_type sVar1;
  PassRunner *runner;
  Replacer local_160;
  FeatureSet local_1c;
  Module *local_18;
  Module *module_local;
  MultiMemoryLowering *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  FeatureSet::FeatureSet(&local_1c,0x8000);
  FeatureSet::disable(&module->features,&local_1c);
  sVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::size(&local_18->memories);
  if (1 < sVar1) {
    this->wasm = local_18;
    prepCombinedMemory(this);
    makeOffsetGlobals(this);
    adjustActiveDataSegmentOffsets(this);
    createMemorySizeFunctions(this);
    createMemoryGrowFunctions(this);
    removeExistingMemories(this);
    addCombinedMemory(this);
    if ((this->isExported & 1U) != 0) {
      updateMemoryExports(this);
    }
    Replacer::Replacer(&local_160,this,this->wasm);
    runner = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
    ::run(&local_160.
           super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
          ,runner,this->wasm);
    Replacer::~Replacer(&local_160);
  }
  return;
}

Assistant:

void run(Module* module) override {
    module->features.disable(FeatureSet::MultiMemory);

    // If there are no memories or 1 memory, skip this pass
    if (module->memories.size() <= 1) {
      return;
    }

    this->wasm = module;

    prepCombinedMemory();
    makeOffsetGlobals();
    adjustActiveDataSegmentOffsets();
    createMemorySizeFunctions();
    createMemoryGrowFunctions();
    removeExistingMemories();
    addCombinedMemory();
    if (isExported) {
      updateMemoryExports();
    }

    Replacer(*this, *wasm).run(getPassRunner(), wasm);
  }